

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

char * raviL_tolstring(lua_State *L,int idx,size_t *len)

{
  int iVar1;
  char *pcVar2;
  lua_Integer lVar3;
  void *pvVar4;
  
  iVar1 = luaL_callmeta(L,idx,"__tostring");
  if (iVar1 != 0) goto LAB_0010df54;
  iVar1 = lua_type(L,idx);
  switch(iVar1) {
  case 0:
    pcVar2 = "nil";
    goto LAB_0010dfee;
  case 1:
    iVar1 = lua_toboolean(L,idx);
    pcVar2 = "true";
    if (iVar1 == 0) {
      pcVar2 = "false";
    }
LAB_0010dfee:
    lua_pushstring(L,pcVar2);
    break;
  default:
    pcVar2 = ravi_typename(L,idx);
    pvVar4 = lua_topointer(L,idx);
    lua_pushfstring(L,"%s: %p",pcVar2,pvVar4);
    break;
  case 3:
    iVar1 = lua_isinteger(L,idx);
    if (iVar1 == 0) {
      lua_tonumberx(L,idx,(int *)0x0);
      lua_pushfstring(L,"%f");
    }
    else {
      lVar3 = lua_tointegerx(L,idx,(int *)0x0);
      lua_pushfstring(L,"%I",lVar3);
    }
    break;
  case 4:
    lua_pushvalue(L,idx);
  }
LAB_0010df54:
  pcVar2 = lua_tolstring(L,-1,len);
  return pcVar2;
}

Assistant:

LUALIB_API const char *raviL_tolstring(lua_State *L, int idx, size_t *len) {
  if (!luaL_callmeta(L, idx, "__tostring")) {  /* no metafield? */
    switch (lua_type(L, idx)) {
    case LUA_TNUMBER: {
      if (lua_isinteger(L, idx))
        lua_pushfstring(L, "%I", lua_tointeger(L, idx));
      else
        lua_pushfstring(L, "%f", lua_tonumber(L, idx));
      break;
    }
    case LUA_TSTRING:
      lua_pushvalue(L, idx);
      break;
    case LUA_TBOOLEAN:
      lua_pushstring(L, (lua_toboolean(L, idx) ? "true" : "false"));
      break;
    case LUA_TNIL:
      lua_pushliteral(L, "nil");
      break;
    default:
      lua_pushfstring(L, "%s: %p", ravi_typename(L, idx),
        lua_topointer(L, idx));
      break;
    }
  }
  return lua_tolstring(L, -1, len);
}